

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
VulkanHppGenerator::gatherResultCodes_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this)

{
  _Rb_tree_header *__position;
  EnumValueData *pEVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  _Base_ptr *pp_Var3;
  undefined8 uVar4;
  int iVar5;
  const_iterator cVar6;
  long *plVar7;
  long lVar8;
  EnumValueData *pEVar9;
  pointer pEVar10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resultCodes;
  EnumValueData rc;
  EnumValueAlias ac;
  undefined1 local_148 [32];
  char *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  long *local_c8;
  _Alloc_hider local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_node local_98 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"VkResult","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
          ::find(&(this->m_enums)._M_t,(key_type *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar6._M_node != &(this->m_enums)._M_t._M_impl.super__Rb_tree_header) {
    __position = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &__position->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &__position->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    pEVar9 = (EnumValueData *)cVar6._M_node[5]._M_left;
    pEVar1 = (EnumValueData *)cVar6._M_node[5]._M_right;
    if (pEVar9 != pEVar1) {
      __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&local_88._M_impl.super__Rb_tree_header + 8);
      pp_Var3 = (_Base_ptr *)((long)&local_88._M_impl.super__Rb_tree_header + 0x18);
      do {
        EnumValueData::EnumValueData((EnumValueData *)local_148,pEVar9);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_108);
        uVar4 = local_148._8_8_;
        for (pEVar10 = (pointer)local_148._0_8_; pEVar10 != (pointer)uVar4; pEVar10 = pEVar10 + 1) {
          pcVar2 = (pEVar10->alias)._M_dataplus._M_p;
          local_98[0]._M_t = &local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,pcVar2,pcVar2 + (pEVar10->alias)._M_string_length);
          pcVar2 = (pEVar10->name)._M_dataplus._M_p;
          local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pp_Var3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__v,pcVar2,pcVar2 + (pEVar10->name)._M_string_length);
          pcVar2 = (pEVar10->protect)._M_dataplus._M_p;
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,pcVar2,pcVar2 + (pEVar10->protect)._M_string_length);
          local_38._0_1_ = pEVar10->supported;
          local_38._1_3_ = *(undefined3 *)&pEVar10->field_0x61;
          local_38._4_4_ = pEVar10->xmlLine;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)__return_storage_ptr__,__v);
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
          if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)pp_Var3) {
            operator_delete(local_88._M_impl.super__Rb_tree_header._M_header._M_parent,
                            (ulong)((long)&(local_88._M_impl.super__Rb_tree_header._M_header.
                                           _M_right)->_M_color + 1));
          }
          if (local_98[0]._M_t != &local_88) {
            operator_delete(local_98[0]._M_t,local_88._M_impl._0_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_p != &local_b0) {
          operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_p != &local_d8) {
          operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._24_8_ != &local_120) {
          operator_delete((void *)local_148._24_8_,local_120._M_allocated_capacity + 1);
        }
        std::
        vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
        ::~vector((vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                   *)local_148);
        pEVar9 = pEVar9 + 1;
      } while (pEVar9 != pEVar1);
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->m_api,"vulkansc");
    if (iVar5 == 0) {
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"VK_ERROR_FRAGMENTATION_EXT","");
      local_128 = local_120._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"VK_ERROR_INVALID_EXTERNAL_HANDLE_KHR","");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"VK_ERROR_INVALID_OPAQUE_CAPTURE_ADDRESS_KHR","");
      local_e8._M_p = (pointer)&local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"VK_ERROR_NOT_PERMITTED_EXT","");
      plVar7 = &local_b8;
      local_c8 = plVar7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"VK_PIPELINE_COMPILE_REQUIRED_EXT","");
      lVar8 = 0;
      local_98[0]._M_t = &__return_storage_ptr__->_M_t;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,(const_iterator)__position,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_148 + lVar8),local_98);
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0xa0);
      lVar8 = -0xa0;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("resultIt != m_enums.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x84f,"std::set<std::string> VulkanHppGenerator::gatherResultCodes() const");
}

Assistant:

std::set<std::string> VulkanHppGenerator::gatherResultCodes() const
{
  auto resultIt = m_enums.find( "VkResult" );
  assert( resultIt != m_enums.end() );
  std::set<std::string> resultCodes;
  for ( auto rc : resultIt->second.values )
  {
    resultCodes.insert( rc.name );
    for ( auto ac : rc.aliases )
    {
      resultCodes.insert( ac.name );
    }
  }
  // some special handling needed for vulkansc!!
  if ( m_api == "vulkansc" )
  {
    resultCodes.insert( { "VK_ERROR_FRAGMENTATION_EXT",
                          "VK_ERROR_INVALID_EXTERNAL_HANDLE_KHR",
                          "VK_ERROR_INVALID_OPAQUE_CAPTURE_ADDRESS_KHR",
                          "VK_ERROR_NOT_PERMITTED_EXT",
                          "VK_PIPELINE_COMPILE_REQUIRED_EXT" } );
  }
  return resultCodes;
}